

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall bsplib::Rdma::ActionBuf::serialize(ActionBuf *this,A2A *a2a)

{
  uint x;
  int __fd;
  int __fd_00;
  int __fd_01;
  unsigned_long x_00;
  unsigned_long x_01;
  unsigned_long x_02;
  unsigned_long x_03;
  unsigned_long uVar1;
  pointer pAVar2;
  ssize_t sVar3;
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  ulong uVar4;
  Category c;
  int in_R8D;
  int iVar5;
  long lVar6;
  TicToc t;
  Time t_1;
  TicToc local_60;
  timespec local_40;
  
  if (0 < a2a->m_nprocs) {
    lVar6 = 0;
    do {
      iVar5 = (int)lVar6;
      serial<unsigned_int>(a2a,iVar5,this->m_dummy_bsmp);
      serial<unsigned_long>
                (a2a,iVar5,
                 (this->m_get_buffer_offset).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6]);
      serial<unsigned_long>
                (a2a,iVar5,
                 (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 < a2a->m_nprocs);
  }
  pAVar2 = (this->m_actions).
           super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_actions).
      super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar2) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      x = *(uint *)((long)&pAVar2->kind + lVar6);
      iVar5 = *(int *)((long)&pAVar2->target_pid + lVar6);
      __fd = *(int *)((long)&pAVar2->src_pid + lVar6);
      __fd_00 = *(int *)((long)&pAVar2->dst_pid + lVar6);
      __fd_01 = *(int *)((long)&pAVar2->tag + lVar6);
      x_00 = *(unsigned_long *)((long)&pAVar2->src_slot + lVar6);
      x_01 = *(unsigned_long *)((long)&pAVar2->dst_slot + lVar6);
      x_02 = *(unsigned_long *)((long)&pAVar2->offset + lVar6);
      x_03 = *(unsigned_long *)((long)&pAVar2->size + lVar6);
      c = (x != 1) + HPPUT;
      if (x == 0) {
        c = GET;
      }
      local_60.m_record = TicToc::push(c);
      clock_gettime(1,&local_40);
      local_60.m_start.tv_sec = local_40.tv_sec;
      local_60.m_start.tv_nsec = local_40.tv_nsec;
      local_60.m_nbytes = 0;
      uVar1 = (a2a->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar5];
      serial<unsigned_int>(a2a,iVar5,x);
      sVar3 = UIntSerialize<int>::write(__fd,&local_40,__n);
      A2A::send(a2a,iVar5,&local_40,(long)(int)sVar3,in_R8D);
      sVar3 = UIntSerialize<int>::write(__fd_00,&local_40,__n_00);
      A2A::send(a2a,iVar5,&local_40,(long)(int)sVar3,in_R8D);
      sVar3 = UIntSerialize<int>::write(__fd_01,&local_40,__n_01);
      A2A::send(a2a,iVar5,&local_40,(long)(int)sVar3,in_R8D);
      serial<unsigned_long>(a2a,iVar5,x_00);
      serial<unsigned_long>(a2a,iVar5,x_01);
      serial<unsigned_long>(a2a,iVar5,x_02);
      serial<unsigned_long>(a2a,iVar5,x_03);
      local_60.m_nbytes =
           local_60.m_nbytes +
           ((a2a->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar5] - uVar1);
      TicToc::~TicToc(&local_60);
      uVar4 = uVar4 + 1;
      pAVar2 = (this->m_actions).
               super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x38;
    } while (uVar4 < (ulong)(((long)(this->m_actions).
                                    super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void Rdma::ActionBuf::serialize( A2A & a2a ) 
{
    for (int p = 0; p < a2a.nprocs(); ++p ) {
        serial( a2a, p, m_dummy_bsmp );
        serial( a2a, p, m_get_buffer_offset[ p ] );
        serial( a2a, p, m_counts[ p ] );
    }

    for (size_t i = 0; i < m_actions.size(); ++i ) 
    {
        Action a = m_actions[i];
#ifdef PROFILE
        TicToc t( a.kind==Action::GET? TicToc::GET:
                  a.kind==Action::HPPUT? TicToc::HPPUT:
                  TicToc::HPGET );
        size_t start = a2a.send_size(a.target_pid);
#endif
        serial( a2a, a.target_pid, unsigned(a.kind) );
        serial( a2a, a.target_pid, a.src_pid );
        serial( a2a, a.target_pid, a.dst_pid );
        serial( a2a, a.target_pid, a.tag );
        serial( a2a, a.target_pid, a.src_slot );
        serial( a2a, a.target_pid, a.dst_slot );
        serial( a2a, a.target_pid, a.offset );
        serial( a2a, a.target_pid, a.size );
#ifdef PROFILE
        size_t end = a2a.send_size(a.target_pid);
        t.add_bytes(end-start);
#endif
    }
}